

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O1

int base64_decode(char *in_base64,int in_len,char *out_bin,int out_len)

{
  int iVar1;
  byte *pbVar3;
  int iVar4;
  char *out_pos;
  byte *pbVar5;
  char *in_pos;
  char cVar6;
  byte bVar7;
  byte *pbVar2;
  
  iVar4 = (int)out_bin;
  *out_bin = '\0';
  iVar1 = iVar4;
  if (0 < out_len) {
    pbVar5 = (byte *)(in_base64 + in_len);
    pbVar3 = (byte *)(out_bin + out_len);
    while (pbVar2 = (byte *)out_bin, (byte *)in_base64 != pbVar5) {
      cVar6 = -1;
      if (0xae < (byte)(*in_base64 + 0x84U)) {
        cVar6 = base64_decode_value_decoding[(byte)*in_base64 - 0x2b];
      }
      in_base64 = (char *)((byte *)in_base64 + 1);
      if (-1 < cVar6) {
        *out_bin = cVar6 << 2;
        if (pbVar3 <= out_bin) break;
        do {
          if ((byte *)in_base64 == pbVar5) goto LAB_0010f88e;
          bVar7 = 0xff;
          if (0xae < (byte)(*in_base64 + 0x84U)) {
            bVar7 = base64_decode_value_decoding[(byte)*in_base64 - 0x2b];
          }
          in_base64 = (char *)((byte *)in_base64 + 1);
        } while ((char)bVar7 < '\0');
        pbVar2 = (byte *)out_bin + 1;
        *out_bin = *out_bin | bVar7 >> 4 & 3;
        if (pbVar3 <= pbVar2) break;
        *pbVar2 = bVar7 << 4;
        do {
          if ((byte *)in_base64 == pbVar5) goto LAB_0010f88e;
          bVar7 = 0xff;
          if (0xae < (byte)(*in_base64 + 0x84U)) {
            bVar7 = base64_decode_value_decoding[(byte)*in_base64 - 0x2b];
          }
          in_base64 = (char *)((byte *)in_base64 + 1);
        } while ((char)bVar7 < '\0');
        pbVar2 = (byte *)out_bin + 2;
        ((byte *)out_bin)[1] = ((byte *)out_bin)[1] | bVar7 >> 2 & 0xf;
        if (pbVar3 <= pbVar2) break;
        *pbVar2 = bVar7 << 6;
        do {
          if ((byte *)in_base64 == pbVar5) goto LAB_0010f88e;
          bVar7 = 0xff;
          if (0xae < (byte)(*in_base64 + 0x84U)) {
            bVar7 = base64_decode_value_decoding[(byte)*in_base64 - 0x2b];
          }
          in_base64 = (char *)((byte *)in_base64 + 1);
        } while ((char)bVar7 < '\0');
        ((byte *)out_bin)[2] = ((byte *)out_bin)[2] | bVar7 & 0x3f;
        out_bin = (char *)((byte *)out_bin + 3);
        pbVar2 = (byte *)out_bin;
        if (pbVar3 <= out_bin) break;
      }
    }
LAB_0010f88e:
    iVar1 = (int)pbVar2;
  }
  return iVar1 - iVar4;
}

Assistant:

static int
base64_decode_block(const char *in_base64, int in_len,
		    char *out_bin, int out_len,
		    struct base64_decodestate *state)
{
	const char *in_pos = in_base64;
	const char *in_end = in_base64 + in_len;
	char *out_pos = out_bin;
	char *out_end = out_bin + out_len;
	char fragment;

	*out_pos = state->result;

	switch (state->step)
	{
		while (1)
		{
	case step_a:
			do {
				if (in_pos == in_end || out_pos >= out_end)
				{
					state->step = step_a;
					state->result = *out_pos;
					return out_pos - out_bin;
				}
				fragment = base64_decode_value(*in_pos++);
			} while (fragment < 0);
			*out_pos    = (fragment & 0x03f) << 2;
			/* fallthrough */
	case step_b:
			do {
				if (in_pos == in_end || out_pos >= out_end)
				{
					state->step = step_b;
					state->result = *out_pos;
					return out_pos - out_bin;
				}
				fragment = base64_decode_value(*in_pos++);
			} while (fragment < 0);
			*out_pos++ |= (fragment & 0x030) >> 4;
			if (out_pos < out_end)
				*out_pos = (fragment & 0x00f) << 4;
			/* fallthrough */
	case step_c:
			do {
				if (in_pos == in_end || out_pos >= out_end)
				{
					state->step = step_c;
					state->result = *out_pos;
					return out_pos - out_bin;
				}
				fragment = base64_decode_value(*in_pos++);
			} while (fragment < 0);
			*out_pos++ |= (fragment & 0x03c) >> 2;
			if (out_pos < out_end)
				*out_pos = (fragment & 0x003) << 6;
			/* fallthrough */
	case step_d:
			do {
				if (in_pos == in_end || out_pos >= out_end)
				{
					state->step = step_d;
					state->result = *out_pos;
					return out_pos - out_bin;
				}
				fragment = base64_decode_value(*in_pos++);
			} while (fragment < 0);
			*out_pos++   |= (fragment & 0x03f);
		}
	}
	/* control should not reach here */
	return out_pos - out_bin;
}